

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_pivot.cpp
# Opt level: O2

void __thiscall
duckdb::Binder::ExtractUnpivotEntries
          (Binder *this,Binder *child_binder,PivotColumnEntry *entry,
          vector<duckdb::UnpivotEntry,_true> *unpivot_entries)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pVVar2;
  pointer puVar3;
  pointer pPVar4;
  BinderException *this_00;
  pointer this_01;
  pointer this_02;
  long *local_e0;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_d8;
  vector<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_> *local_d0;
  string local_c8;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  star_columns;
  UnpivotEntry unpivot_entry;
  
  local_d8._M_head_impl =
       (entry->expr).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  paVar1 = &unpivot_entry.alias.field_2;
  local_d0 = &unpivot_entries->
              super_vector<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>;
  if (local_d8._M_head_impl == (ParsedExpression *)0x0) {
    unpivot_entry.alias._M_string_length = 0;
    unpivot_entry.alias.field_2._M_local_buf[0] = '\0';
    unpivot_entry.column_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    unpivot_entry.column_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    unpivot_entry.column_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    unpivot_entry.expressions.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    unpivot_entry.expressions.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    unpivot_entry.expressions.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    unpivot_entry.alias._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_assign((string *)&unpivot_entry);
    pVVar2 = (entry->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_02 = (entry->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_start; this_02 != pVVar2; this_02 = this_02 + 1) {
      Value::ToString_abi_cxx11_((string *)&star_columns,this_02);
      if (star_columns.
          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        this_00 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_c8,"UNPIVOT - empty column name not supported",
                   (allocator *)&local_e0);
        BinderException::BinderException(this_00,&local_c8);
        __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string&>
                ((duckdb *)&local_e0,(string *)&star_columns);
      local_c8._M_dataplus._M_p = (pointer)local_e0;
      local_e0 = (long *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&unpivot_entry.expressions,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_c8);
      if ((long *)local_c8._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_c8._M_dataplus._M_p + 8))();
      }
      local_c8._M_dataplus._M_p = (pointer)0x0;
      if (local_e0 != (long *)0x0) {
        (**(code **)(*local_e0 + 8))();
      }
      ::std::__cxx11::string::~string((string *)&star_columns);
    }
    ::std::vector<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>::
    emplace_back<duckdb::UnpivotEntry>(local_d0,&unpivot_entry);
    UnpivotEntry::~UnpivotEntry(&unpivot_entry);
  }
  else {
    star_columns.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    star_columns.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    star_columns.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (entry->expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    ExpandStarExpression
              (child_binder,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_d8,&star_columns);
    if (local_d8._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_d8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    puVar3 = star_columns.
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_d8._M_head_impl = (ParsedExpression *)0x0;
    for (this_01 = star_columns.
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar3;
        this_01 = this_01 + 1) {
      unpivot_entry.alias._M_string_length = 0;
      unpivot_entry.alias.field_2._M_local_buf[0] = '\0';
      unpivot_entry.expressions.
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      unpivot_entry.expressions.
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      unpivot_entry.column_names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      unpivot_entry.expressions.
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      unpivot_entry.column_names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      unpivot_entry.column_names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      unpivot_entry.alias._M_dataplus._M_p = (pointer)paVar1;
      pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(this_01);
      if ((pPVar4->super_BaseExpression).alias._M_string_length != 0) {
        unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
        operator->(this_01);
        ::std::__cxx11::string::_M_assign((string *)&unpivot_entry);
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&unpivot_entry.expressions,this_01);
      ::std::vector<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>::
      emplace_back<duckdb::UnpivotEntry>(local_d0,&unpivot_entry);
      UnpivotEntry::~UnpivotEntry(&unpivot_entry);
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&star_columns.
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             );
  }
  return;
}

Assistant:

void Binder::ExtractUnpivotEntries(Binder &child_binder, PivotColumnEntry &entry,
                                   vector<UnpivotEntry> &unpivot_entries) {
	if (!entry.expr) {
		// pivot entry without an expression - generate one
		UnpivotEntry unpivot_entry;
		unpivot_entry.alias = entry.alias;
		for (auto &val : entry.values) {
			auto column_name = val.ToString();
			if (column_name.empty()) {
				throw BinderException("UNPIVOT - empty column name not supported");
			}
			unpivot_entry.expressions.push_back(make_uniq<ColumnRefExpression>(column_name));
		}
		unpivot_entries.push_back(std::move(unpivot_entry));
		return;
	}
	D_ASSERT(entry.values.empty());
	// expand star expressions (if any)
	vector<unique_ptr<ParsedExpression>> star_columns;
	child_binder.ExpandStarExpression(std::move(entry.expr), star_columns);

	for (auto &expr : star_columns) {
		// create one pivot entry per result column
		UnpivotEntry unpivot_entry;
		if (!expr->GetAlias().empty()) {
			unpivot_entry.alias = expr->GetAlias();
		}
		unpivot_entry.expressions.push_back(std::move(expr));
		unpivot_entries.push_back(std::move(unpivot_entry));
	}
}